

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void do_xsave(CPUX86State *env,target_ulong ptr,uint64_t rfbm,uint64_t inuse,uint64_t opt,
             uintptr_t ra)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t new_bv;
  uint64_t old_bv;
  uintptr_t ra_local;
  uint64_t opt_local;
  uint64_t inuse_local;
  uint64_t rfbm_local;
  target_ulong ptr_local;
  CPUX86State *env_local;
  
  if ((env->cr[4] & 0x40000) == 0) {
    raise_exception_ra_x86_64(env,6,ra);
  }
  if ((ptr & 0x3f) != 0) {
    raise_exception_ra_x86_64(env,0xd,ra);
  }
  uVar1 = env->xcr0 & rfbm;
  uVar2 = uVar1 & opt;
  if ((uVar2 & 1) != 0) {
    do_xsave_fpu(env,ptr,ra);
  }
  if ((uVar1 & 2) != 0) {
    do_xsave_mxcsr(env,ptr,ra);
  }
  if ((uVar2 & 2) != 0) {
    do_xsave_sse(env,ptr,ra);
  }
  if ((uVar2 & 8) != 0) {
    do_xsave_bndregs(env,ptr + 0x3c0,ra);
  }
  if ((uVar2 & 0x10) != 0) {
    do_xsave_bndcsr(env,ptr + 0x400,ra);
  }
  if ((uVar2 & 0x200) != 0) {
    do_xsave_pkru(env,ptr + 0xa80,ra);
  }
  uVar3 = cpu_ldq_data_ra_x86_64(env,ptr + 0x200,ra);
  cpu_stq_data_ra_x86_64(env,ptr + 0x200,uVar3 & (uVar1 ^ 0xffffffffffffffff) | inuse & uVar1,ra);
  return;
}

Assistant:

static void do_xsave(CPUX86State *env, target_ulong ptr, uint64_t rfbm,
                     uint64_t inuse, uint64_t opt, uintptr_t ra)
{
    uint64_t old_bv, new_bv;

    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, ra);
    }

    /* The operand must be 64 byte aligned.  */
    if (ptr & 63) {
        raise_exception_ra(env, EXCP0D_GPF, ra);
    }

    /* Never save anything not enabled by XCR0.  */
    rfbm &= env->xcr0;
    opt &= rfbm;

    if (opt & XSTATE_FP_MASK) {
        do_xsave_fpu(env, ptr, ra);
    }
    if (rfbm & XSTATE_SSE_MASK) {
        /* Note that saving MXCSR is not suppressed by XSAVEOPT.  */
        do_xsave_mxcsr(env, ptr, ra);
    }
    if (opt & XSTATE_SSE_MASK) {
        do_xsave_sse(env, ptr, ra);
    }
    if (opt & XSTATE_BNDREGS_MASK) {
        do_xsave_bndregs(env, ptr + XO(bndreg_state), ra);
    }
    if (opt & XSTATE_BNDCSR_MASK) {
        do_xsave_bndcsr(env, ptr + XO(bndcsr_state), ra);
    }
    if (opt & XSTATE_PKRU_MASK) {
        do_xsave_pkru(env, ptr + XO(pkru_state), ra);
    }

    /* Update the XSTATE_BV field.  */
    old_bv = cpu_ldq_data_ra(env, ptr + XO(header.xstate_bv), ra);
    new_bv = (old_bv & ~rfbm) | (inuse & rfbm);
    cpu_stq_data_ra(env, ptr + XO(header.xstate_bv), new_bv, ra);
}